

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (StringOneofFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringOneofFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter
            ((Formatter *)local_50,printer,
             &(this->super_StringFieldGenerator).super_FieldGenerator.variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline const std::string& $classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\ntemplate <typename ArgT0, typename... ArgT>\ninline void $classname$::set_$name$(ArgT0&& arg0, ArgT... args) {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  $field_member$.$setter$($default_value_tag$, static_cast<ArgT0 &&>(arg0), args..., GetArenaForAllocation());\n$annotate_set$  // @@protoc_insertion_point(field_set:$full_name$)\n}\ninline std::string* $classname$::mutable_$name$() {\n  std::string* _s = _internal_mutable_$name$();\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _s;\n}\ninline const std::string& $classname$::_internal_$name$() const {\n  if (_internal_has_$name$()) {\n    return $field_member$.Get();\n  }\n  return $default_string$;\n}\ninline void $classname$::_internal_set_$name$(const std::string& value) {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  $field_member$.Set($default_value_tag$, value, GetArenaForAllocation());\n}\n"
            );
  Formatter::operator()<>
            ((Formatter *)local_50,
             "inline std::string* $classname$::_internal_mutable_$name$() {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($init_value$);\n  }\n  return $field_member$.Mutable(\n      $default_variable_or_tag$, GetArenaForAllocation());\n}\ninline std::string* $classname$::$release_name$() {\n$annotate_release$  // @@protoc_insertion_point(field_release:$full_name$)\n  if (_internal_has_$name$()) {\n    clear_has_$oneof_name$();\n    return $field_member$.ReleaseNonDefault($init_value$, GetArenaForAllocation());\n  } else {\n    return nullptr;\n  }\n}\ninline void $classname$::set_allocated_$name$(std::string* $name$) {\n  if (has_$oneof_name$()) {\n    clear_$oneof_name$();\n  }\n  if ($name$ != nullptr) {\n    set_has_$name$();\n    $field_member$.UnsafeSetDefault($name$);\n    ::$proto_ns$::Arena* arena = GetArenaForAllocation();\n    if (arena != nullptr) {\n      arena->Own($name$);\n    }\n  }\n$annotate_set$  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n}\n"
            );
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringOneofFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline const std::string& $classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "template <typename ArgT0, typename... ArgT>\n"
      "inline void $classname$::set_$name$(ArgT0&& arg0, ArgT... args) {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  $field_member$.$setter$($default_value_tag$,"
      " static_cast<ArgT0 &&>(arg0), args..., GetArenaForAllocation());\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set:$full_name$)\n"
      "}\n"
      "inline std::string* $classname$::mutable_$name$() {\n"
      "  std::string* _s = _internal_mutable_$name$();\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _s;\n"
      "}\n"
      "inline const std::string& $classname$::_internal_$name$() const {\n"
      "  if (_internal_has_$name$()) {\n"
      "    return $field_member$.Get();\n"
      "  }\n"
      "  return $default_string$;\n"
      "}\n"
      "inline void $classname$::_internal_set_$name$(const std::string& "
      "value) {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  $field_member$.Set($default_value_tag$, value, "
      "GetArenaForAllocation());\n"
      "}\n");
  format(
      "inline std::string* $classname$::_internal_mutable_$name$() {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($init_value$);\n"
      "  }\n"
      "  return $field_member$.Mutable(\n"
      "      $default_variable_or_tag$, GetArenaForAllocation());\n"
      "}\n"
      "inline std::string* $classname$::$release_name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "  if (_internal_has_$name$()) {\n"
      "    clear_has_$oneof_name$();\n"
      "    return $field_member$.ReleaseNonDefault($init_value$, "
      "GetArenaForAllocation());\n"
      "  } else {\n"
      "    return nullptr;\n"
      "  }\n"
      "}\n"
      "inline void $classname$::set_allocated_$name$(std::string* $name$) {\n"
      "  if (has_$oneof_name$()) {\n"
      "    clear_$oneof_name$();\n"
      "  }\n"
      "  if ($name$ != nullptr) {\n"
      "    set_has_$name$();\n"
      "    $field_member$.UnsafeSetDefault($name$);\n"
      "    ::$proto_ns$::Arena* arena = GetArenaForAllocation();\n"
      "    if (arena != nullptr) {\n"
      "      arena->Own($name$);\n"
      "    }\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_set_allocated:$full_name$)\n"
      "}\n");
}